

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_negation_range_inplace
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  
  bitset_flip_range(src->words,range_start,range_end);
  iVar1 = bitset_container_compute_cardinality(src);
  src->cardinality = iVar1;
  if (iVar1 < 0x1001) {
    paVar2 = array_container_from_bitset(src);
    *dst = paVar2;
    bitset_container_free(src);
  }
  else {
    *dst = src;
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_container_negation_range_inplace(bitset_container_t *src,
                                             const int range_start,
                                             const int range_end,
                                             container_t **dst) {
    bitset_flip_range(src->words, (uint32_t)range_start, (uint32_t)range_end);
    src->cardinality = bitset_container_compute_cardinality(src);
    if (src->cardinality > DEFAULT_MAX_SIZE) {
        *dst = src;
        return true;
    }
    *dst = array_container_from_bitset(src);
    bitset_container_free(src);
    return false;
}